

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEST_135>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEST_135> *this)

{
  code *pcVar1;
  long *plVar2;
  CATCH2_INTERNAL_TEST_135 obj;
  undefined1 local_650 [1600];
  
  anon_unknown.dwarf_52c65e::TestCallback::TestCallback((TestCallback *)local_650);
  local_650._0_8_ = &PTR__sessionFIX40Fixture_0032a638;
  local_650._8_8_ = &PTR__sessionFIX40Fixture_0032a690;
  local_650._1592_8_ = FIX::SocketServer::accept;
  local_650._1584_8_ = (Session *)0x0;
  anon_unknown.dwarf_52c65e::sessionFIX40Fixture::createSession
            ((sessionFIX40Fixture *)local_650,1,-1,-1);
  local_650._0_8_ = &PTR__sessionFIX40Fixture_0032a540;
  local_650._8_8_ = &DAT_0032a598;
  pcVar1 = (code *)this->m_testAsMethod;
  plVar2 = (long *)((long)&(((sessionFIX40Fixture *)local_650)->super_TestCallback).super_Responder.
                           _vptr_Responder + *(long *)&this->field_0x10);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
  }
  (*pcVar1)(plVar2);
  anon_unknown.dwarf_52c65e::sessionFIX40Fixture::~sessionFIX40Fixture
            ((sessionFIX40Fixture *)local_650);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }